

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_pop(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int shift)

{
  JSValue val;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue this_obj;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue obj_03;
  JSValue JVar1;
  int iVar2;
  BOOL BVar3;
  undefined4 in_ECX;
  JSContext *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  JSValue JVar4;
  JSValue JVar5;
  JSObject *p;
  uint32_t count32;
  JSValue *arrp;
  int64_t newLen;
  int64_t len;
  JSValue res;
  JSValue obj;
  JSValue v;
  JSAtom in_stack_fffffffffffffecc;
  JSContext *in_stack_fffffffffffffed0;
  int32_t in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int64_t in_stack_fffffffffffffee0;
  JSValueUnion in_stack_fffffffffffffee8;
  JSValueUnion in_stack_fffffffffffffef0;
  JSValueUnion in_stack_fffffffffffffef8;
  int64_t in_stack_ffffffffffffff00;
  JSValueUnion JVar6;
  JSContext *in_stack_ffffffffffffff08;
  JSValueUnion ctx_00;
  int64_t iVar7;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  JSValueUnion *local_d8;
  long lVar8;
  ulong local_c8;
  JSValueUnion local_c0;
  JSValueUnion local_b8;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  int32_t local_70;
  undefined4 uStack_6c;
  JSValueUnion local_68;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  local_c0.float64 = 0.0;
  local_b8.float64 = 1.48219693752374e-323;
  JVar4.tag._0_4_ = in_stack_ffffffffffffff70;
  JVar4.u = (JSValueUnion)in_R8;
  JVar4.tag._4_4_ = in_ECX;
  JVar4 = JS_ToObject((JSContext *)CONCAT44(in_R9D,in_stack_ffffffffffffff60),JVar4);
  JVar6 = JVar4.u;
  iVar7 = JVar4.tag;
  JVar5.tag = in_stack_ffffffffffffff00;
  JVar5.u.float64 = in_stack_fffffffffffffef8.float64;
  ctx_00 = JVar6;
  iVar2 = js_get_length64((JSContext *)in_stack_fffffffffffffef0.ptr,
                          (int64_t *)in_stack_fffffffffffffee8.ptr,JVar5);
  if (iVar2 == 0) {
    lVar8 = 0;
    if (0 < (long)local_c8) {
      lVar8 = local_c8 - 1;
      BVar3 = js_get_fast_array(in_RDI,JVar4,(JSValue **)&local_d8,
                                (uint32_t *)&stack0xffffffffffffff24);
      if ((BVar3 == 0) || (in_stack_ffffffffffffff24 != local_c8)) {
        if (in_R9D == 0) {
          obj_03.tag._0_4_ = in_stack_ffffffffffffff20;
          obj_03.u.ptr = (void *)iVar7;
          obj_03.tag._4_4_ = in_stack_ffffffffffffff24;
          JVar5 = JS_GetPropertyInt64((JSContext *)ctx_00.ptr,obj_03,
                                      (int64_t)in_stack_ffffffffffffff08);
          local_c0 = JVar5.u;
          local_b8 = (JSValueUnion)JVar5.tag;
          in_stack_fffffffffffffee8 = local_c0;
          in_stack_fffffffffffffef0 = local_b8;
          iVar2 = JS_IsException(JVar5);
        }
        else {
          obj_02.tag._0_4_ = in_stack_ffffffffffffff20;
          obj_02.u.ptr = (void *)iVar7;
          obj_02.tag._4_4_ = in_stack_ffffffffffffff24;
          JVar5 = JS_GetPropertyInt64((JSContext *)ctx_00.ptr,obj_02,
                                      (int64_t)in_stack_ffffffffffffff08);
          local_c0 = JVar5.u;
          local_b8 = (JSValueUnion)JVar5.tag;
          in_stack_fffffffffffffef8 = local_c0;
          JVar6 = local_b8;
          iVar2 = JS_IsException(JVar5);
          if (iVar2 != 0) goto LAB_0017982d;
          obj_01.tag = iVar7;
          obj_01.u.ptr = ctx_00.ptr;
          iVar2 = JS_CopySubArray(in_stack_ffffffffffffff08,obj_01,(int64_t)JVar6,
                                  (int64_t)in_stack_fffffffffffffef8,
                                  (int64_t)in_stack_fffffffffffffef0,(int)lVar8);
        }
        if ((iVar2 != 0) ||
           (obj_00.tag = (int64_t)in_stack_fffffffffffffef8.ptr,
           obj_00.u.ptr = in_stack_fffffffffffffef0.ptr,
           iVar2 = JS_DeletePropertyInt64
                             ((JSContext *)in_stack_fffffffffffffee8.ptr,obj_00,
                              in_stack_fffffffffffffee0,in_stack_fffffffffffffedc), iVar2 < 0))
        goto LAB_0017982d;
      }
      else if (in_R9D == 0) {
        local_c0 = local_d8[(ulong)(in_stack_ffffffffffffff24 - 1) * 2];
        local_b8 = (JSValueUnion)(local_d8 + (ulong)(in_stack_ffffffffffffff24 - 1) * 2)[1].ptr;
        *(int *)((long)JVar6.ptr + 0x40) = *(int *)((long)JVar6.ptr + 0x40) + -1;
      }
      else {
        local_c0 = *local_d8;
        local_b8 = (JSValueUnion)local_d8[1].ptr;
        memmove(local_d8,local_d8 + 2,(ulong)(in_stack_ffffffffffffff24 - 1) << 4);
        *(int *)((long)JVar6.ptr + 0x40) = *(int *)((long)JVar6.ptr + 0x40) + -1;
      }
    }
    if (lVar8 == (int)lVar8) {
      local_30._4_4_ = uStack_c;
      local_30.int32 = (int)lVar8;
      local_28 = 0;
      in_stack_fffffffffffffed0 = in_RDI;
    }
    else {
      JVar5 = __JS_NewFloat64(in_RDI,(double)lVar8);
      local_60 = JVar5.u;
      local_30 = local_60;
      local_58 = JVar5.tag;
      local_28 = local_58;
      in_stack_fffffffffffffed0 = in_RDI;
    }
    in_stack_fffffffffffffed8 = local_30.int32;
    in_stack_fffffffffffffedc = local_30._4_4_;
    this_obj.tag = (int64_t)in_stack_fffffffffffffef0.ptr;
    this_obj.u.ptr = in_stack_fffffffffffffee8.ptr;
    val.tag = local_28;
    val.u.float64 = local_30.float64;
    iVar2 = JS_SetProperty(in_stack_fffffffffffffed0,this_obj,in_stack_fffffffffffffecc,val);
    in_stack_fffffffffffffee0 = local_28;
    if (-1 < iVar2) {
      v_00.u._4_4_ = in_stack_fffffffffffffedc;
      v_00.u.int32 = in_stack_fffffffffffffed8;
      v_00.tag = local_28;
      JS_FreeValue(in_stack_fffffffffffffed0,v_00);
      local_70 = local_c0.int32;
      uStack_6c = local_c0._4_4_;
      local_68.float64 = local_b8.float64;
      goto LAB_0017987b;
    }
  }
LAB_0017982d:
  v_01.u._4_4_ = in_stack_fffffffffffffedc;
  v_01.u.int32 = in_stack_fffffffffffffed8;
  v_01.tag = in_stack_fffffffffffffee0;
  JS_FreeValue(in_stack_fffffffffffffed0,v_01);
  v_02.u._4_4_ = in_stack_fffffffffffffedc;
  v_02.u.int32 = in_stack_fffffffffffffed8;
  v_02.tag = in_stack_fffffffffffffee0;
  JS_FreeValue(in_stack_fffffffffffffed0,v_02);
  local_70 = 0;
  local_68.float64 = 2.96439387504748e-323;
LAB_0017987b:
  JVar1.u._4_4_ = uStack_6c;
  JVar1.u.int32 = local_70;
  JVar1.tag = (int64_t)local_68.ptr;
  return JVar1;
}

Assistant:

static JSValue js_array_pop(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv, int shift)
{
    JSValue obj, res = JS_UNDEFINED;
    int64_t len, newLen;
    JSValue *arrp;
    uint32_t count32;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;
    newLen = 0;
    if (len > 0) {
        newLen = len - 1;
        /* Special case fast arrays */
        if (js_get_fast_array(ctx, obj, &arrp, &count32) && count32 == len) {
            JSObject *p = JS_VALUE_GET_OBJ(obj);
            if (shift) {
                res = arrp[0];
                memmove(arrp, arrp + 1, (count32 - 1) * sizeof(*arrp));
                p->u.array.count--;
            } else {
                res = arrp[count32 - 1];
                p->u.array.count--;
            }
        } else {
            if (shift) {
                res = JS_GetPropertyInt64(ctx, obj, 0);
                if (JS_IsException(res))
                    goto exception;
                if (JS_CopySubArray(ctx, obj, 0, 1, len - 1, +1))
                    goto exception;
            } else {
                res = JS_GetPropertyInt64(ctx, obj, newLen);
                if (JS_IsException(res))
                    goto exception;
            }
            if (JS_DeletePropertyInt64(ctx, obj, newLen, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewInt64(ctx, newLen)) < 0)
        goto exception;

    JS_FreeValue(ctx, obj);
    return res;

 exception:
    JS_FreeValue(ctx, res);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}